

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::attWildCardIntersection
          (TraverseSchema *this,SchemaAttDef *resultWildCard,SchemaAttDef *compareWildCard)

{
  AttTypes AVar1;
  uint uVar2;
  uint uVar3;
  QName *pQVar4;
  ValueVectorOf<unsigned_int> *pVVar5;
  ulong uVar6;
  SchemaAttDef *pSVar7;
  ulong uVar8;
  int iVar9;
  SchemaAttDef *pSVar10;
  undefined4 extraout_var;
  uint *puVar11;
  ValueVectorOf<unsigned_int> *pVVar12;
  undefined4 extraout_var_00;
  bool bVar13;
  AttTypes AVar14;
  XMLSize_t i;
  XMLSize_t XVar15;
  ulong uVar16;
  XMLSize_t i_1;
  XMLSize_t XVar17;
  bool bVar18;
  ValueVectorOf<unsigned_int> tmpURIList;
  ValueVectorOf<unsigned_int> local_70;
  AttTypes local_44;
  SchemaAttDef *local_40;
  ValueVectorOf<unsigned_int> *local_38;
  
  AVar1 = (resultWildCard->super_XMLAttDef).fType;
  AVar14 = (compareWildCard->super_XMLAttDef).fType;
  if (AVar1 != AttTypes_Unknown && AVar14 != Any_Any) {
    if (AVar1 == Any_Any || AVar14 == AttTypes_Unknown) {
      pVVar12 = resultWildCard->fNamespaceList;
      if ((pVVar12 != (ValueVectorOf<unsigned_int> *)0x0) && (pVVar12->fCurCount != 0)) {
        pVVar12->fCurCount = 0;
      }
      resultWildCard->fAttName->fURIId = compareWildCard->fAttName->fURIId;
      (resultWildCard->super_XMLAttDef).fType = AVar14;
    }
    else {
      if ((AVar1 ^ Any_List) != AttTypes_Min || (AVar14 ^ Any_Other) != AttTypes_Min) {
        if ((AVar1 ^ Any_Other) != AttTypes_Min || (AVar14 ^ Any_List) != AttTypes_Min) {
          if ((AVar1 ^ Any_List) != AttTypes_Min || (AVar14 ^ Any_List) != AttTypes_Min) {
            if ((AVar1 ^ Any_Other) != AttTypes_Min || (AVar14 ^ Any_Other) != AttTypes_Min) {
              return;
            }
            pQVar4 = resultWildCard->fAttName;
            uVar2 = compareWildCard->fAttName->fURIId;
            if (pQVar4->fURIId == uVar2) {
              return;
            }
            uVar3 = this->fEmptyNamespaceURI;
            if (pQVar4->fURIId == uVar3) {
              pQVar4->fURIId = uVar2;
              return;
            }
            if (uVar2 == uVar3) {
              return;
            }
            pQVar4->fURIId = uVar3;
            (resultWildCard->super_XMLAttDef).fType = AttTypes_Unknown;
            return;
          }
          pVVar12 = compareWildCard->fNamespaceList;
          if (pVVar12 == (ValueVectorOf<unsigned_int> *)0x0) {
            XVar17 = 0;
          }
          else {
            XVar17 = pVVar12->fCurCount;
          }
          pVVar5 = resultWildCard->fNamespaceList;
          if (XVar17 == 0) {
            if (pVVar5 == (ValueVectorOf<unsigned_int> *)0x0) {
              return;
            }
            if (pVVar5->fCurCount == 0) {
              return;
            }
            pVVar5->fCurCount = 0;
            return;
          }
          local_70.fMemoryManager = this->fGrammarPoolMemoryManager;
          local_70.fCallDestructor = false;
          XVar15 = 0;
          local_70.fCurCount = 0;
          local_70.fElemList = (uint *)0x0;
          local_70.fMaxCount = XVar17;
          iVar9 = (*(local_70.fMemoryManager)->_vptr_MemoryManager[3])();
          local_70.fElemList = (uint *)CONCAT44(extraout_var_00,iVar9);
          memset(local_70.fElemList,0,local_70.fMaxCount << 2);
          do {
            puVar11 = ValueVectorOf<unsigned_int>::elementAt(pVVar12,XVar15);
            if (pVVar5 != (ValueVectorOf<unsigned_int> *)0x0) {
              uVar2 = *puVar11;
              uVar6 = pVVar5->fCurCount;
              bVar18 = uVar6 != 0;
              if (uVar6 == 0) {
LAB_0033666b:
                if (!bVar18) goto LAB_00336692;
              }
              else if (*pVVar5->fElemList != uVar2) {
                uVar8 = 1;
                do {
                  uVar16 = uVar8;
                  if (uVar6 == uVar16) break;
                  uVar8 = uVar16 + 1;
                } while (pVVar5->fElemList[uVar16] != uVar2);
                bVar18 = uVar16 < uVar6;
                goto LAB_0033666b;
              }
              ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_70,1);
              local_70.fElemList[local_70.fCurCount] = uVar2;
              local_70.fCurCount = local_70.fCurCount + 1;
            }
LAB_00336692:
            XVar15 = XVar15 + 1;
            if (XVar15 == XVar17) {
              SchemaAttDef::setNamespaceList(resultWildCard,&local_70);
              (*(local_70.fMemoryManager)->_vptr_MemoryManager[4])
                        (local_70.fMemoryManager,local_70.fElemList);
              return;
            }
          } while( true );
        }
      }
      pSVar10 = compareWildCard;
      pSVar7 = resultWildCard;
      if (AVar14 == Any_List) {
        pSVar10 = resultWildCard;
        pSVar7 = compareWildCard;
      }
      local_38 = pSVar7->fNamespaceList;
      if (local_38 == (ValueVectorOf<unsigned_int> *)0x0) {
        XVar17 = 0;
      }
      else {
        XVar17 = local_38->fCurCount;
      }
      if (XVar17 != 0) {
        uVar2 = pSVar10->fAttName->fURIId;
        local_70.fMemoryManager = this->fGrammarPoolMemoryManager;
        local_70.fCallDestructor = false;
        local_70.fCurCount = 0;
        local_70.fElemList = (uint *)0x0;
        local_70.fMaxCount = XVar17;
        local_44 = AVar14;
        local_40 = compareWildCard;
        iVar9 = (*(local_70.fMemoryManager)->_vptr_MemoryManager[3])();
        local_70.fElemList = (uint *)CONCAT44(extraout_var,iVar9);
        memset(local_70.fElemList,0,local_70.fMaxCount << 2);
        XVar15 = 0;
        bVar18 = false;
        do {
          puVar11 = ValueVectorOf<unsigned_int>::elementAt(local_38,XVar15);
          uVar3 = *puVar11;
          bVar13 = true;
          if ((uVar3 != uVar2) && (uVar3 != this->fEmptyNamespaceURI)) {
            ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_70,1);
            local_70.fElemList[local_70.fCurCount] = uVar3;
            local_70.fCurCount = local_70.fCurCount + 1;
            bVar13 = bVar18;
          }
          AVar14 = local_44;
          XVar15 = XVar15 + 1;
          bVar18 = bVar13;
        } while (XVar17 != XVar15);
        if (local_44 == Any_List || bVar13) {
          pVVar12 = resultWildCard->fNamespaceList;
          if (local_70.fCurCount == 0) {
            if ((pVVar12 != (ValueVectorOf<unsigned_int> *)0x0) && (pVVar12->fCurCount != 0)) {
              pVVar12->fCurCount = 0;
            }
          }
          else if (pVVar12 == (ValueVectorOf<unsigned_int> *)0x0) {
            pVVar12 = (ValueVectorOf<unsigned_int> *)
                      XMemory::operator_new(0x28,(resultWildCard->super_XMLAttDef).fMemoryManager);
            ValueVectorOf<unsigned_int>::ValueVectorOf(pVVar12,&local_70);
            resultWildCard->fNamespaceList = pVVar12;
          }
          else {
            ValueVectorOf<unsigned_int>::operator=(pVVar12,&local_70);
          }
        }
        (*(local_70.fMemoryManager)->_vptr_MemoryManager[4])
                  (local_70.fMemoryManager,local_70.fElemList);
        compareWildCard = local_40;
      }
      if (AVar14 != Any_List) {
        return;
      }
      resultWildCard->fAttName->fURIId = compareWildCard->fAttName->fURIId;
      (resultWildCard->super_XMLAttDef).fType = (compareWildCard->super_XMLAttDef).fType;
    }
    (resultWildCard->super_XMLAttDef).fDefaultType = (compareWildCard->super_XMLAttDef).fDefaultType
    ;
  }
  return;
}

Assistant:

void
TraverseSchema::attWildCardIntersection(SchemaAttDef* const resultWildCard,
                                        const SchemaAttDef* const compareWildCard) {

    XMLAttDef::AttTypes typeR = resultWildCard->getType();
    XMLAttDef::AttTypes typeC = compareWildCard->getType();

    //If either O1 or O2 is any, then the other must be the value.
    if (typeC == XMLAttDef::Any_Any ||
        typeR == XMLAttDef::AttTypes_Unknown) {
        return;
    }

    if (typeR == XMLAttDef::Any_Any ||
        typeC == XMLAttDef::AttTypes_Unknown) {

        resultWildCard->resetNamespaceList();
        copyWildCardData(compareWildCard, resultWildCard);
        return;
    }

    // If either O1 or O2 is a pair of not and a namespace name and the other
    // is a set, then that set, minus the negated namespace name if it was in
    // is the value
    if ((typeC == XMLAttDef::Any_Other && typeR == XMLAttDef::Any_List) ||
        (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_List)) {

        unsigned int compareURI = 0;
        ValueVectorOf<unsigned int>* nameURIList = 0;

        if (typeC == XMLAttDef::Any_List) {
            nameURIList = compareWildCard->getNamespaceList();
            compareURI = resultWildCard->getAttName()->getURI();
        }
        else {
            nameURIList = resultWildCard->getNamespaceList();
            compareURI = compareWildCard->getAttName()->getURI();
        }

        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {

            bool                        found = false;
            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int nameURI = nameURIList->elementAt(i);

                if (nameURI != compareURI &&
                    nameURI != (unsigned int) fEmptyNamespaceURI) {
                    tmpURIList.addElement(nameURI);
                }
                else {
                    found = true;
                }
            }

            if (found || typeC == XMLAttDef::Any_List) {
                resultWildCard->setNamespaceList(&tmpURIList);
            }
        }

        if (typeC == XMLAttDef::Any_List) {
            copyWildCardData(compareWildCard, resultWildCard);
        }

        return;
    }

    // If both O1 and O2 are sets, then the intersection of those sets must be
    // the value.
    if (typeR == XMLAttDef::Any_List && typeC == XMLAttDef::Any_List) {

        ValueVectorOf<unsigned int>* uriListR = resultWildCard->getNamespaceList();
        ValueVectorOf<unsigned int>* uriListC = compareWildCard->getNamespaceList();
        XMLSize_t listSize = (uriListC) ? uriListC->size() : 0;

        if (listSize) {

            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int uriName = uriListC->elementAt(i);

                if (uriListR && uriListR->containsElement(uriName)) {
                    tmpURIList.addElement(uriName);
                }
            }

            resultWildCard->setNamespaceList(&tmpURIList);
        }
        else {
            resultWildCard->resetNamespaceList();
        }

        return;
    }

    // If the two are negations of different namespace names, then:
    //  if one is a negation of absent, then result is negation of namespace
    //  else intersection is not expressible.
    if (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_Other) {

        QName* qnameR = resultWildCard->getAttName();

        if (qnameR->getURI() != compareWildCard->getAttName()->getURI()) {

            if (qnameR->getURI() == (unsigned int)fEmptyNamespaceURI) {
                qnameR->setURI(compareWildCard->getAttName()->getURI());
            }
            else if (compareWildCard->getAttName()->getURI() != (unsigned int)fEmptyNamespaceURI) {

                qnameR->setURI(fEmptyNamespaceURI);
                resultWildCard->setType(XMLAttDef::AttTypes_Unknown);
            }
        }
    }
}